

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkRSDA.cpp
# Opt level: O2

void __thiscall chrono::ChLinkRSDA::ChLinkRSDA(ChLinkRSDA *this,ChLinkRSDA *other)

{
  ChBodyFrame *pCVar1;
  double dVar2;
  undefined1 auVar3 [16];
  
  ChLink::ChLink(&this->super_ChLink,&other->super_ChLink);
  auVar3 = ZEXT816(0) << 0x40;
  (this->super_ChLink).super_ChLinkBase.super_ChPhysicsItem.super_ChObj._vptr_ChObj =
       (_func_int **)&PTR__ChLinkRSDA_01166398;
  (this->m_csys1).pos.m_data[0] = 0.0;
  (this->m_csys1).pos.m_data[1] = 0.0;
  (this->m_csys1).pos.m_data[2] = 0.0;
  (this->m_csys1).rot.m_data[0] = 1.0;
  *(undefined1 (*) [32])((this->m_csys1).rot.m_data + 1) = ZEXT1632(auVar3);
  *(undefined1 (*) [32])((this->m_csys1).rot.m_data + 3) = ZEXT1632(auVar3);
  (this->m_csys2).rot.m_data[0] = 1.0;
  this->m_torque = 0.0;
  *(undefined1 (*) [32])((this->m_csys2).rot.m_data + 1) = ZEXT1632(auVar3);
  *(undefined1 (*) [32])((this->m_csys2).rot.m_data + 3) = ZEXT1632(auVar3);
  this->m_turns = 0;
  (this->m_torque_fun).
  super___shared_ptr<chrono::ChLinkRSDA::TorqueFunctor,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->m_torque_fun).
  super___shared_ptr<chrono::ChLinkRSDA::TorqueFunctor,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  pCVar1 = (other->super_ChLink).Body2;
  (this->super_ChLink).Body1 = (other->super_ChLink).Body1;
  (this->super_ChLink).Body2 = pCVar1;
  (this->super_ChLink).super_ChLinkBase.super_ChPhysicsItem.system =
       (other->super_ChLink).super_ChLinkBase.super_ChPhysicsItem.system;
  ChCoordsys<double>::operator=(&this->m_csys1,&other->m_csys1);
  ChCoordsys<double>::operator=(&this->m_csys2,&other->m_csys2);
  this->m_turns = other->m_turns;
  this->m_auto_rest_angle = other->m_auto_rest_angle;
  this->m_rest_angle = other->m_rest_angle;
  dVar2 = other->m_angle_dt;
  this->m_angle = other->m_angle;
  this->m_angle_dt = dVar2;
  dVar2 = other->m_r;
  this->m_k = other->m_k;
  this->m_r = dVar2;
  this->m_t = other->m_t;
  std::__shared_ptr<chrono::ChLinkRSDA::TorqueFunctor,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->m_torque_fun).
              super___shared_ptr<chrono::ChLinkRSDA::TorqueFunctor,_(__gnu_cxx::_Lock_policy)2>,
             &(other->m_torque_fun).
              super___shared_ptr<chrono::ChLinkRSDA::TorqueFunctor,_(__gnu_cxx::_Lock_policy)2>);
  return;
}

Assistant:

ChLinkRSDA::ChLinkRSDA(const ChLinkRSDA& other) : ChLink(other), m_turns(0), m_torque(0) {
    Body1 = other.Body1;
    Body2 = other.Body2;
    system = other.system;

    m_csys1 = other.m_csys1;
    m_csys2 = other.m_csys2;

    m_turns = other.m_turns;
    m_auto_rest_angle = other.m_auto_rest_angle;
    m_rest_angle = other.m_rest_angle;

    m_angle = other.m_angle;
    m_angle_dt = other.m_angle_dt;

    m_k = other.m_k;
    m_r = other.m_r;
    m_t = other.m_t;

    m_torque_fun = other.m_torque_fun;
}